

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_signature_map_entry.c
# Opt level: O2

apx_portSignatureMapEntry_t * apx_portSignatureMapEntry_new(void)

{
  apx_portSignatureMapEntry_t *self;
  
  self = (apx_portSignatureMapEntry_t *)malloc(0x48);
  if (self != (apx_portSignatureMapEntry_t *)0x0) {
    apx_portSignatureMapEntry_create(self);
  }
  return self;
}

Assistant:

apx_portSignatureMapEntry_t *apx_portSignatureMapEntry_new(void)
{
   apx_portSignatureMapEntry_t *self = (apx_portSignatureMapEntry_t*) malloc(sizeof(apx_portSignatureMapEntry_t));
   if(self != NULL)
   {
      apx_portSignatureMapEntry_create(self);
   }
   return self;
}